

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::set_empty_key(dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                *this,key_type *key)

{
  size_type count;
  pointer table_start;
  
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_empty_ = true;
  g_num_copies = g_num_copies + 1;
  (this->key_info).empty_key.i_ = key->i_;
  *(undefined8 *)(this->key_info).empty_key.buffer_ = *(undefined8 *)key->buffer_;
  *(undefined4 *)((this->key_info).empty_key.buffer_ + 8) = *(undefined4 *)(key->buffer_ + 8);
  count = this->num_buckets;
  table_start = (pointer)malloc(count * 0x14);
  this->table = table_start;
  fill_range_with_empty(this,table_start,count);
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }